

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaElementPtr xmlSchemaGetElem(xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName)

{
  int iVar1;
  void *local_38;
  xmlSchemaImportPtr import;
  xmlSchemaElementPtr ret;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaPtr schema_local;
  
  import = (xmlSchemaImportPtr)0x0;
  if ((name == (xmlChar *)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    schema_local = (xmlSchemaPtr)0x0;
  }
  else {
    if ((schema != (xmlSchemaPtr)0x0) &&
       (((iVar1 = xmlStrEqual(nsName,schema->targetNamespace), iVar1 == 0 ||
         (import = (xmlSchemaImportPtr)xmlHashLookup(schema->elemDecl,name),
         import == (xmlSchemaImportPtr)0x0)) &&
        (iVar1 = xmlHashSize(schema->schemasImports), 1 < iVar1)))) {
      if (nsName == (xmlChar *)0x0) {
        local_38 = xmlHashLookup(schema->schemasImports,(xmlChar *)"##");
      }
      else {
        local_38 = xmlHashLookup(schema->schemasImports,nsName);
      }
      if (local_38 != (void *)0x0) {
        import = (xmlSchemaImportPtr)
                 xmlHashLookup(*(xmlHashTablePtr *)(*(long *)((long)local_38 + 0x50) + 0x50),name);
      }
    }
    schema_local = (xmlSchemaPtr)import;
  }
  return (xmlSchemaElementPtr)schema_local;
}

Assistant:

static xmlSchemaElementPtr
xmlSchemaGetElem(xmlSchemaPtr schema, const xmlChar * name,
                 const xmlChar * nsName)
{
    xmlSchemaElementPtr ret = NULL;

    if ((name == NULL) || (schema == NULL))
        return(NULL);
    if (schema != NULL) {
	WXS_FIND_GLOBAL_ITEM(elemDecl)
    }
exit:
#ifdef DEBUG
    if (ret == NULL) {
        if (nsName == NULL)
            fprintf(stderr, "Unable to lookup element decl. %s", name);
        else
            fprintf(stderr, "Unable to lookup element decl. %s:%s", name,
                    nsName);
    }
#endif
    return (ret);
}